

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

TimerId __thiscall sznet::net::EventLoop::runAfter(EventLoop *this,double delay,TimerCallback *cb)

{
  TimerId TVar1;
  function<void_()> local_68;
  Timestamp local_48;
  int64_t local_40;
  int64_t local_38;
  Timestamp time;
  TimerCallback *cb_local;
  double delay_local;
  EventLoop *this_local;
  
  time.m_microSecondsSinceEpoch = (int64_t)cb;
  local_40 = (int64_t)Timestamp::now();
  local_48 = addTime((Timestamp)local_40,delay);
  local_38 = local_48.m_microSecondsSinceEpoch;
  std::function<void_()>::function(&local_68,cb);
  TVar1 = runAt(this,local_48,&local_68);
  std::function<void_()>::~function(&local_68);
  return TVar1;
}

Assistant:

TimerId EventLoop::runAfter(double delay, TimerCallback cb)
{
	Timestamp time(addTime(Timestamp::now(), delay));
	return runAt(time, std::move(cb));
}